

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  Config *pCVar1;
  IMutableContext *pIVar2;
  ostream *poVar3;
  int iVar4;
  Session *this_00;
  Colour local_c9;
  string local_c8;
  undefined1 local_a8 [56];
  InternalParseResult result;
  
  if (this->m_startupExceptions == false) {
    Clara::Args::Args((Args *)local_a8,argc,argv);
    Clara::Detail::ParserBase::parse(&result,(ParserBase *)this,(Args *)local_a8);
    this_00 = (Session *)local_a8;
    Clara::Args::~Args((Args *)this_00);
    if (result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.m_type == Ok
       ) {
      if ((this->m_configData).showHelp == true) {
        this_00 = this;
        showHelp(this);
      }
      if ((this->m_configData).libIdentify == true) {
        libIdentify(this_00);
      }
      pCVar1 = (this->m_config).m_ptr;
      if (pCVar1 != (Config *)0x0) {
        (*(pCVar1->super_IConfig)._vptr_IConfig[1])();
      }
      (this->m_config).m_ptr = (Config *)0x0;
      iVar4 = 0;
    }
    else {
      config(this);
      pIVar2 = getCurrentMutableContext();
      (*(pIVar2->super_IContext)._vptr_IContext[7])(pIVar2,(this->m_config).m_ptr);
      local_c9.m_moved = false;
      Colour::use(Red);
      poVar3 = std::operator<<((ostream *)&std::cerr,"\nError(s) in input:\n");
      std::__cxx11::string::string((string *)&local_c8,(string *)&result.m_errorMessage);
      TextFlow::Column::Column((Column *)local_a8,&local_c8);
      local_a8._40_8_ = (pointer)0x2;
      TextFlow::operator<<(poVar3,(Column *)local_a8);
      std::operator<<(poVar3,"\n\n");
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      Colour::~Colour(&local_c9);
      poVar3 = std::operator<<((ostream *)&std::cerr,"Run with -? for usage\n");
      iVar4 = 0xff;
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::~BasicResult(&result);
  }
  else {
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Session::applyCommandLine(int argc, char const *const *argv) {
        if (m_startupExceptions)
            return 1;

        auto result = m_cli.parse(Clara::Args(argc, argv));
        if (!result) {
            config();
            getCurrentMutableContext().setConfig(m_config.get());
            Catch::cerr()
                << Colour(Colour::Red)
                << "\nError(s) in input:\n"
                << TextFlow::Column(result.errorMessage()).indent(2)
                << "\n\n";
            Catch::cerr() << "Run with -? for usage\n" << std::endl;
            return MaxExitCode;
        }

        if (m_configData.showHelp)
            showHelp();
        if (m_configData.libIdentify)
            libIdentify();
        m_config.reset();
        return 0;
    }